

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O3

void __thiscall CFG::eliminateNonReachableSymbols(CFG *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  ostream *poVar4;
  pointer pbVar5;
  pointer ppPVar6;
  char *this_00;
  pointer __src;
  CFG *this_01;
  int iVar7;
  ulong uVar8;
  pointer ppPVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reachableSymbols;
  allocator_type local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  string local_c0;
  string local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  paVar1 = &local_f8.field_2;
  pcVar2 = (this->startS)._M_dataplus._M_p;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar2,pcVar2 + (this->startS)._M_string_length);
  __l._M_len = 1;
  __l._M_array = &local_f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d8,__l,&local_f9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  do {
    bVar3 = expandReachableSymbols(this,&local_d8);
  } while (bVar3);
  this_00 = "Reachable symbols: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reachable symbols: ",0x13);
  vecToStr(&local_f8,(CFG *)this_00,&local_d8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_f8._M_dataplus._M_p,local_f8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  pbVar5 = (this->nonTerminalsV).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->nonTerminalsV).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar5) {
    uVar8 = 0;
    iVar7 = 0;
    do {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      pcVar2 = pbVar5[uVar8]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,pcVar2,pcVar2 + pbVar5[uVar8]._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,&local_d8);
      bVar3 = inVector(&local_a0,&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&this->nonTerminalsV,
                   (this->nonTerminalsV).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar8);
        iVar7 = iVar7 + -1;
      }
      iVar7 = iVar7 + 1;
      uVar8 = (ulong)iVar7;
      pbVar5 = (this->nonTerminalsV).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->nonTerminalsV).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5));
  }
  pbVar5 = (this->terminalsT).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->terminalsT).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar5) {
    local_80 = &this->terminalsT;
    uVar8 = 0;
    iVar7 = 0;
    do {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      pcVar2 = pbVar5[uVar8]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar2,pcVar2 + pbVar5[uVar8]._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_60,&local_d8);
      bVar3 = inVector(&local_c0,&local_60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(local_80,(local_80->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar8);
        iVar7 = iVar7 + -1;
      }
      iVar7 = iVar7 + 1;
      uVar8 = (ulong)iVar7;
      pbVar5 = (this->terminalsT).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->terminalsT).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5));
  }
  ppPVar9 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppPVar9) {
    uVar8 = 0;
    iVar7 = 0;
    do {
      this_01 = (CFG *)&stack0xffffffffffffff88;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stack0xffffffffffffff88,&local_d8);
      bVar3 = reachableProduction(this_01,ppPVar9 + uVar8,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&stack0xffffffffffffff88);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xffffffffffffff88);
      ppPVar9 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppPVar6 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (!bVar3) {
        __src = ppPVar9 + uVar8 + 1;
        if (__src != ppPVar6) {
          memmove(ppPVar9 + uVar8,__src,(long)ppPVar6 - (long)__src);
          ppPVar9 = (this->productionsP).
                    super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppPVar6 = (this->productionsP).
                    super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        ppPVar6 = ppPVar6 + -1;
        (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl
        .super__Vector_impl_data._M_finish = ppPVar6;
        iVar7 = iVar7 + -1;
      }
      iVar7 = iVar7 + 1;
      uVar8 = (ulong)iVar7;
    } while (uVar8 < (ulong)((long)ppPVar6 - (long)ppPVar9 >> 3));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  return;
}

Assistant:

void CFG::eliminateNonReachableSymbols() {
    // Find all reachable symbols (and thus also the nonreachable)
    std::vector<std::string> reachableSymbols = {startS};
    while (expandReachableSymbols(reachableSymbols)) {}

    std::cout << "Reachable symbols: " << vecToStr(reachableSymbols) << std::endl;

    // Remove all non-reachable symbols from variables, terminals and productions
    for (int i = 0; i < nonTerminalsV.size(); ++i) {
        if (!inVector(nonTerminalsV[i], reachableSymbols)) {
            nonTerminalsV.erase(nonTerminalsV.begin() + i);
            --i;
        }
    }

    for (int i = 0; i < terminalsT.size(); ++i) {
        if (!inVector(terminalsT[i], reachableSymbols)) {
            terminalsT.erase(terminalsT.begin() + i);
            --i;
        }
    }


    for (int j = 0; j < productionsP.size(); ++j) {
        if (!reachableProduction(productionsP[j], reachableSymbols)) {
            productionsP.erase(productionsP.begin() + j);
            --j;
        }
    }
}